

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  nccfgstate local_58;
  
  local_58.bindir.c_str = (char *)0x0;
  local_58.bindir.size = 0;
  local_58.bindir.buflen = 0;
  local_58.bindir.owns_memory = 0;
  local_58.shlibdir_override.c_str = (char *)0x0;
  local_58.shlibdir_override.size = 0;
  local_58.shlibdir_override.buflen = 0;
  local_58.shlibdir_override.owns_memory = 0;
  local_58.argc = argc;
  local_58.argv = argv;
  iVar1 = mainprog(&local_58);
  mcu8str_dealloc(&local_58.bindir);
  mcu8str_dealloc(&local_58.shlibdir_override);
  return iVar1;
}

Assistant:

int main ( int argc, char** argv )
{
  nccfgstate state;
  state.argc = argc;
  state.argv = argv;
  state.bindir.c_str = NULL;
  state.bindir.size = 0;
  state.bindir.buflen = 0;
  state.bindir.owns_memory = 0;
  state.shlibdir_override.c_str = NULL;
  state.shlibdir_override.size = 0;
  state.shlibdir_override.buflen = 0;
  state.shlibdir_override.owns_memory = 0;

  if ( mcplcfg_boolopt_expects_shlibdir_override() ) {
    //Expects hidden trailing arguments '+' 'shlibdir' (to support having
    //MCPL.dll in %PATH% on windows)
    if ( argc >= 3 && argv[argc-2][0] == '+' && argv[argc-2][1] == '\0'  ) {
      state.shlibdir_override = mcu8str_create_from_cstr( argv[argc-1] );
      state.argc -= 2;
    } else {
      mcu8str cmdname = mcplcfg_thiscmdname(&state);
      fprintf(stderr,"%s: installation error (shlibdir override absent).\n",
              cmdname.c_str);
      mcu8str_dealloc(&cmdname);
      return 1;
    }
  }

  int res = mainprog( &state );
  mcu8str_dealloc(&state.bindir);
  mcu8str_dealloc(&state.shlibdir_override);
  return res;
}